

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispLexer.cpp
# Opt level: O2

void __thiscall
Shell::LispLexer::readQuotedString
          (LispLexer *this,Token *token,char opening,char closing,char escapeChar)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  LexerException *pLVar4;
  undefined3 in_register_00000009;
  undefined3 in_register_00000081;
  int iVar5;
  byte bVar6;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  iVar5 = CONCAT31(in_register_00000081,escapeChar);
  bVar6 = 0;
  do {
    bVar2 = Lexer::readNextChar(&this->super_Lexer);
    if (!bVar2) {
      pLVar4 = (LexerException *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"file ended while reading quoted string ",&local_71);
      LexerException::LexerException(pLVar4,&local_70,&this->super_Lexer);
      __cxa_throw(pLVar4,&LexerException::typeinfo,LexerException::~LexerException);
    }
    iVar1 = (this->super_Lexer)._lastCharacter;
    if ((bool)(closing == escapeChar | bVar6 | iVar1 != iVar5)) {
      if (iVar1 == CONCAT31(in_register_00000009,closing)) {
        if (bVar6 == 0) {
          if (closing != escapeChar) {
LAB_0055dfb9:
            Lexer::saveTokenText(&this->super_Lexer,token);
            Lexer::readNextChar(&this->super_Lexer);
            token->tag = TT_NAME;
            return;
          }
          iVar3 = Lexer::lookAhead(&this->super_Lexer);
          if (iVar3 != CONCAT31(in_register_00000009,closing)) goto LAB_0055dfb9;
          Lexer::readNextChar(&this->super_Lexer);
          goto LAB_0055dfb0;
        }
      }
      else if (bVar6 == 0xff && iVar1 != iVar5) {
        pLVar4 = (LexerException *)__cxa_allocate_exception(0x48);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"invalid escape sequence in quoted string ",&local_71);
        LexerException::LexerException(pLVar4,&local_50,&this->super_Lexer);
        __cxa_throw(pLVar4,&LexerException::typeinfo,LexerException::~LexerException);
      }
      Lexer::saveLastChar(&this->super_Lexer);
    }
LAB_0055dfb0:
    bVar6 = (closing == escapeChar | bVar6 | iVar1 != iVar5) ^ 1;
  } while( true );
}

Assistant:

void LispLexer::readQuotedString(Token& token, char opening, char closing, char escapeChar)
{
  bool escape=false;
  // Don't save this char so that the final string doesn't contain the quote symbol
  //saveLastChar();

  while (readNextChar()) {
    if (_lastCharacter == escapeChar && !escape && closing != escapeChar) {
      escape=true;
    }
    else if (_lastCharacter == closing && !escape) {
      if(closing == escapeChar && lookAhead() == closing){
        readNextChar();
      }
      else{
        // Don't save this char so that the final string doesn't contain the quote symbol
        //saveLastChar();
        saveTokenText(token);
        readNextChar();
        token.tag = TT_NAME;
        return;
      }
    }
    else {
      if (escape && _lastCharacter!=closing && _lastCharacter!=escapeChar) {
	throw LexerException((std::string)"invalid escape sequence in quoted string ", *this);
      }
      escape=false;
      saveLastChar();
    }
  }
  throw LexerException((std::string)"file ended while reading quoted string ", *this);
}